

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

bool ImGui::SliderBehaviorT<float,float,float>
               (ImRect *bb,ImGuiID id,ImGuiDataType data_type,float *v,float v_min,float v_max,
               char *format,ImGuiSliderFlags flags,ImRect *out_grab_bb)

{
  ImVec2 IVar1;
  undefined1 auVar2 [12];
  ImGuiContext *pIVar3;
  uint uVar4;
  int iVar5;
  ImGuiContext *g;
  float *pfVar6;
  bool is_logarithmic;
  ulong idx;
  bool bVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float logarithmic_zero_epsilon;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [64];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float zero_deadzone_halfsize;
  float old_clicked_t;
  float t;
  undefined1 extraout_var [56];
  
  pIVar3 = GImGui;
  uVar4 = flags & 0x100000;
  idx = (ulong)(uVar4 >> 0x14);
  uVar8 = data_type & 0xfffffffe;
  is_logarithmic = (bool)((byte)((flags & 0x20U) >> 5) & uVar8 == 8);
  fVar9 = ImVec2::operator[](&bb->Max,idx);
  fVar10 = ImVec2::operator[](&bb->Min,idx);
  fVar10 = (fVar9 - fVar10) + -4.0;
  fVar9 = (pIVar3->Style).GrabMinSize;
  auVar17 = ZEXT416((uint)fVar9);
  auVar19 = vcmpss_avx(ZEXT416((uint)v_min),ZEXT416((uint)v_max),1);
  auVar19 = vblendvps_avx(ZEXT416((uint)(v_min - v_max)),ZEXT416((uint)(v_max - v_min)),auVar19);
  fVar14 = auVar19._0_4_;
  if ((uVar8 != 8) && (0.0 <= fVar14)) {
    auVar21 = ZEXT416((uint)(fVar10 / (fVar14 + 1.0)));
    auVar17 = vcmpss_avx(ZEXT416((uint)fVar9),auVar21,2);
    auVar17 = vblendvps_avx(ZEXT416((uint)fVar9),auVar21,auVar17);
  }
  auVar17 = vminss_avx(auVar17,ZEXT416((uint)fVar10));
  fVar11 = auVar17._0_4_;
  fVar9 = fVar10 - fVar11;
  fVar12 = ImVec2::operator[](&bb->Min,idx);
  fVar13 = ImVec2::operator[](&bb->Max,idx);
  zero_deadzone_halfsize = 0.0;
  logarithmic_zero_epsilon = 0.0;
  if (is_logarithmic != false) {
    iVar5 = ImParseFormatPrecision(format,3);
    logarithmic_zero_epsilon = powf(0.1,(float)iVar5);
    auVar17 = vmaxss_avx(ZEXT416((uint)fVar9),ZEXT416(0x3f800000));
    zero_deadzone_halfsize = ((pIVar3->Style).LogSliderDeadzone * 0.5) / auVar17._0_4_;
  }
  fVar12 = fVar12 + 2.0 + fVar11 * 0.5;
  if (pIVar3->ActiveId == id) {
    if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
      if (pIVar3->ActiveIdIsJustActivated == true) {
        pIVar3->SliderCurrentAccum = 0.0;
        pIVar3->SliderCurrentAccumDirty = false;
      }
      auVar20._0_8_ = GetNavInputAmount2d(3,ImGuiInputReadMode_RepeatFast,0.0,0.0);
      auVar20._8_56_ = extraout_var;
      auVar17 = auVar20._0_16_;
      if (uVar4 != 0) {
        auVar21 = vmovshdup_avx(auVar17);
        auVar17._0_8_ = auVar21._0_8_ ^ 0x8000000080000000;
        auVar17._8_4_ = auVar21._8_4_ ^ 0x80000000;
        auVar17._12_4_ = auVar21._12_4_ ^ 0x80000000;
      }
      fVar9 = auVar17._0_4_;
      if ((fVar9 != 0.0) || (NAN(fVar9))) {
        auVar2 = auVar17._4_12_;
        if ((uVar8 == 8) && (iVar5 = ImParseFormatPrecision(format,3), 0 < iVar5)) {
          auVar18._0_4_ = fVar9 / 100.0;
          auVar18._4_12_ = auVar2;
          auVar22._0_4_ = auVar18._0_4_ / 10.0;
          auVar22._4_12_ = auVar2;
          auVar19 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xe]),1);
          auVar19 = vblendvps_avx(auVar18,auVar22,auVar19);
        }
        else {
          auVar21._8_4_ = 0x7fffffff;
          auVar21._0_8_ = 0x7fffffff7fffffff;
          auVar21._12_4_ = 0x7fffffff;
          auVar19 = vandps_avx(auVar21,auVar19);
          if ((auVar19._0_4_ <= 100.0) || (0.0 < (GImGui->IO).NavInputs[0xe])) {
            auVar19 = vcmpss_avx(auVar17,ZEXT816(0) << 0x40,1);
            auVar23._8_4_ = 0xbf800000;
            auVar23._0_8_ = 0xbf800000bf800000;
            auVar23._12_4_ = 0xbf800000;
            auVar24._8_4_ = 0x3f800000;
            auVar24._0_8_ = 0x3f8000003f800000;
            auVar24._12_4_ = 0x3f800000;
            auVar17 = vblendvps_avx(auVar24,auVar23,auVar19);
            auVar19._0_4_ = auVar17._0_4_ / fVar14;
            auVar19._4_12_ = auVar17._4_12_;
          }
          else {
            auVar19._0_4_ = fVar9 / 100.0;
            auVar19._4_12_ = auVar2;
          }
        }
        auVar17 = vcmpss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(GImGui->IO).NavInputs[0xf]),1);
        auVar19 = vblendvps_avx(auVar19,ZEXT416((uint)(auVar19._0_4_ * 10.0)),auVar17);
        fVar9 = auVar19._0_4_ + pIVar3->SliderCurrentAccum;
        pIVar3->SliderCurrentAccum = fVar9;
        pIVar3->SliderCurrentAccumDirty = true;
      }
      else {
        fVar9 = pIVar3->SliderCurrentAccum;
      }
      if ((pIVar3->NavActivatePressedId == id) && (pIVar3->ActiveIdIsJustActivated == false)) {
        ClearActiveID();
      }
      else if (pIVar3->SliderCurrentAccumDirty == true) {
        fVar14 = ScaleRatioFromValueT<float,float,float>
                           (data_type,*v,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                            zero_deadzone_halfsize);
        if (((fVar14 < 1.0) || (fVar9 <= 0.0)) && ((0.0 < fVar14 || (0.0 <= fVar9)))) {
          auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar9 + fVar14)));
          auVar19 = vcmpss_avx(ZEXT416((uint)(fVar9 + fVar14)),ZEXT816(0) << 0x40,1);
          auVar19 = vandnps_avx(auVar19,auVar17);
          t = auVar19._0_4_;
          fVar15 = ScaleValueFromRatioT<float,float,float>
                             (data_type,t,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                              zero_deadzone_halfsize);
          if ((flags & 0x40U) == 0) {
            fVar15 = RoundScalarWithFormatT<float,float>(format,data_type,fVar15);
          }
          fVar15 = ScaleRatioFromValueT<float,float,float>
                             (data_type,fVar15,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                              zero_deadzone_halfsize);
          fVar15 = fVar15 - fVar14;
          bVar7 = fVar9 <= fVar15;
          if (0.0 < fVar9) {
            bVar7 = fVar15 < fVar9;
          }
          if (!bVar7) {
            fVar15 = fVar9;
          }
          pIVar3->SliderCurrentAccum = pIVar3->SliderCurrentAccum - fVar15;
          pIVar3->SliderCurrentAccumDirty = false;
          goto LAB_00173b37;
        }
        pIVar3->SliderCurrentAccum = 0.0;
        pIVar3->SliderCurrentAccumDirty = false;
      }
    }
    else {
      if (pIVar3->ActiveIdSource != ImGuiInputSource_Mouse) goto LAB_00173b94;
      if ((pIVar3->IO).MouseDown[0] != false) {
        pfVar6 = ImVec2::operator[](&(pIVar3->IO).MousePos,idx);
        t = 0.0;
        if (0.0 < fVar9) {
          auVar16._0_4_ = (*pfVar6 - fVar12) / fVar9;
          auVar16._4_12_ = SUB6012((undefined1  [60])0x0,0);
          auVar17 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar16);
          auVar19 = vcmpss_avx(auVar16,ZEXT816(0) << 0x40,1);
          auVar19 = vandnps_avx(auVar19,auVar17);
          t = auVar19._0_4_;
        }
        if (uVar4 != 0) {
          t = 1.0 - t;
        }
LAB_00173b37:
        fVar9 = ScaleValueFromRatioT<float,float,float>
                          (data_type,t,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                           zero_deadzone_halfsize);
        if ((flags & 0x40U) == 0) {
          fVar9 = RoundScalarWithFormatT<float,float>(format,data_type,fVar9);
        }
        if ((*v != fVar9) || (NAN(*v) || NAN(fVar9))) {
          *v = fVar9;
          bVar7 = true;
        }
        else {
          bVar7 = false;
        }
        goto LAB_00173dfa;
      }
      ClearActiveID();
    }
    bVar7 = false;
  }
  else {
LAB_00173b94:
    bVar7 = false;
  }
LAB_00173dfa:
  if (1.0 <= fVar10) {
    fVar9 = ScaleRatioFromValueT<float,float,float>
                      (data_type,*v,v_min,v_max,is_logarithmic,logarithmic_zero_epsilon,
                       zero_deadzone_halfsize);
    if (uVar4 != 0) {
      fVar9 = 1.0 - fVar9;
    }
    fVar12 = (((fVar13 + -2.0) - fVar11 * 0.5) - fVar12) * fVar9 + fVar12;
    if (uVar4 != 0) {
      fVar9 = (bb->Max).x;
      (out_grab_bb->Min).x = (bb->Min).x + 2.0;
      (out_grab_bb->Min).y = -fVar11 * 0.5 + fVar12;
      (out_grab_bb->Max).x = fVar9 + -2.0;
      (out_grab_bb->Max).y = fVar11 * 0.5 + fVar12;
    }
    else {
      fVar9 = (bb->Min).y;
      fVar10 = (bb->Max).y;
      (out_grab_bb->Min).x = -fVar11 * 0.5 + fVar12;
      (out_grab_bb->Min).y = fVar9 + 2.0;
      (out_grab_bb->Max).x = fVar11 * 0.5 + fVar12;
      (out_grab_bb->Max).y = fVar10 + -2.0;
    }
  }
  else {
    IVar1 = bb->Min;
    out_grab_bb->Min = IVar1;
    out_grab_bb->Max = IVar1;
  }
  return bVar7;
}

Assistant:

bool ImGui::SliderBehaviorT(const ImRect& bb, ImGuiID id, ImGuiDataType data_type, TYPE* v, const TYPE v_min, const TYPE v_max, const char* format, ImGuiSliderFlags flags, ImRect* out_grab_bb)
{
    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    const ImGuiAxis axis = (flags & ImGuiSliderFlags_Vertical) ? ImGuiAxis_Y : ImGuiAxis_X;
    const bool is_decimal = (data_type == ImGuiDataType_Float) || (data_type == ImGuiDataType_Double);
    const bool is_logarithmic = (flags & ImGuiSliderFlags_Logarithmic) && is_decimal;

    const float grab_padding = 2.0f;
    const float slider_sz = (bb.Max[axis] - bb.Min[axis]) - grab_padding * 2.0f;
    float grab_sz = style.GrabMinSize;
    SIGNEDTYPE v_range = (v_min < v_max ? v_max - v_min : v_min - v_max);
    if (!is_decimal && v_range >= 0)                                             // v_range < 0 may happen on integer overflows
        grab_sz = ImMax((float)(slider_sz / (v_range + 1)), style.GrabMinSize);  // For integer sliders: if possible have the grab size represent 1 unit
    grab_sz = ImMin(grab_sz, slider_sz);
    const float slider_usable_sz = slider_sz - grab_sz;
    const float slider_usable_pos_min = bb.Min[axis] + grab_padding + grab_sz * 0.5f;
    const float slider_usable_pos_max = bb.Max[axis] - grab_padding - grab_sz * 0.5f;

    float logarithmic_zero_epsilon = 0.0f; // Only valid when is_logarithmic is true
    float zero_deadzone_halfsize = 0.0f; // Only valid when is_logarithmic is true
    if (is_logarithmic)
    {
        // When using logarithmic sliders, we need to clamp to avoid hitting zero, but our choice of clamp value greatly affects slider precision. We attempt to use the specified precision to estimate a good lower bound.
        const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 1;
        logarithmic_zero_epsilon = ImPow(0.1f, (float)decimal_precision);
        zero_deadzone_halfsize = (style.LogSliderDeadzone * 0.5f) / ImMax(slider_usable_sz, 1.0f);
    }

    // Process interacting with the slider
    bool value_changed = false;
    if (g.ActiveId == id)
    {
        bool set_new_value = false;
        float clicked_t = 0.0f;
        if (g.ActiveIdSource == ImGuiInputSource_Mouse)
        {
            if (!g.IO.MouseDown[0])
            {
                ClearActiveID();
            }
            else
            {
                const float mouse_abs_pos = g.IO.MousePos[axis];
                clicked_t = (slider_usable_sz > 0.0f) ? ImClamp((mouse_abs_pos - slider_usable_pos_min) / slider_usable_sz, 0.0f, 1.0f) : 0.0f;
                if (axis == ImGuiAxis_Y)
                    clicked_t = 1.0f - clicked_t;
                set_new_value = true;
            }
        }
        else if (g.ActiveIdSource == ImGuiInputSource_Nav)
        {
            if (g.ActiveIdIsJustActivated)
            {
                g.SliderCurrentAccum = 0.0f; // Reset any stored nav delta upon activation
                g.SliderCurrentAccumDirty = false;
            }

            const ImVec2 input_delta2 = GetNavInputAmount2d(ImGuiNavDirSourceFlags_Keyboard | ImGuiNavDirSourceFlags_PadDPad, ImGuiInputReadMode_RepeatFast, 0.0f, 0.0f);
            float input_delta = (axis == ImGuiAxis_X) ? input_delta2.x : -input_delta2.y;
            if (input_delta != 0.0f)
            {
                const int decimal_precision = is_decimal ? ImParseFormatPrecision(format, 3) : 0;
                if (decimal_precision > 0)
                {
                    input_delta /= 100.0f;    // Gamepad/keyboard tweak speeds in % of slider bounds
                    if (IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta /= 10.0f;
                }
                else
                {
                    if ((v_range >= -100.0f && v_range <= 100.0f) || IsNavInputDown(ImGuiNavInput_TweakSlow))
                        input_delta = ((input_delta < 0.0f) ? -1.0f : +1.0f) / (float)v_range; // Gamepad/keyboard tweak speeds in integer steps
                    else
                        input_delta /= 100.0f;
                }
                if (IsNavInputDown(ImGuiNavInput_TweakFast))
                    input_delta *= 10.0f;

                g.SliderCurrentAccum += input_delta;
                g.SliderCurrentAccumDirty = true;
            }

            float delta = g.SliderCurrentAccum;
            if (g.NavActivatePressedId == id && !g.ActiveIdIsJustActivated)
            {
                ClearActiveID();
            }
            else if (g.SliderCurrentAccumDirty)
            {
                clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                if ((clicked_t >= 1.0f && delta > 0.0f) || (clicked_t <= 0.0f && delta < 0.0f)) // This is to avoid applying the saturation when already past the limits
                {
                    set_new_value = false;
                    g.SliderCurrentAccum = 0.0f; // If pushing up against the limits, don't continue to accumulate
                }
                else
                {
                    set_new_value = true;
                    float old_clicked_t = clicked_t;
                    clicked_t = ImSaturate(clicked_t + delta);

                    // Calculate what our "new" clicked_t will be, and thus how far we actually moved the slider, and subtract this from the accumulator
                    TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
                    if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                        v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);
                    float new_clicked_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, v_new, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

                    if (delta > 0)
                        g.SliderCurrentAccum -= ImMin(new_clicked_t - old_clicked_t, delta);
                    else
                        g.SliderCurrentAccum -= ImMax(new_clicked_t - old_clicked_t, delta);
                }

                g.SliderCurrentAccumDirty = false;
            }
        }

        if (set_new_value)
        {
            TYPE v_new = ScaleValueFromRatioT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, clicked_t, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);

            // Round to user desired precision based on format string
            if (!(flags & ImGuiSliderFlags_NoRoundToFormat))
                v_new = RoundScalarWithFormatT<TYPE, SIGNEDTYPE>(format, data_type, v_new);

            // Apply result
            if (*v != v_new)
            {
                *v = v_new;
                value_changed = true;
            }
        }
    }

    if (slider_sz < 1.0f)
    {
        *out_grab_bb = ImRect(bb.Min, bb.Min);
    }
    else
    {
        // Output grab position so it can be displayed by the caller
        float grab_t = ScaleRatioFromValueT<TYPE, SIGNEDTYPE, FLOATTYPE>(data_type, *v, v_min, v_max, is_logarithmic, logarithmic_zero_epsilon, zero_deadzone_halfsize);
        if (axis == ImGuiAxis_Y)
            grab_t = 1.0f - grab_t;
        const float grab_pos = ImLerp(slider_usable_pos_min, slider_usable_pos_max, grab_t);
        if (axis == ImGuiAxis_X)
            *out_grab_bb = ImRect(grab_pos - grab_sz * 0.5f, bb.Min.y + grab_padding, grab_pos + grab_sz * 0.5f, bb.Max.y - grab_padding);
        else
            *out_grab_bb = ImRect(bb.Min.x + grab_padding, grab_pos - grab_sz * 0.5f, bb.Max.x - grab_padding, grab_pos + grab_sz * 0.5f);
    }

    return value_changed;
}